

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

mat<4UL,_4UL> * __thiscall
mat<4UL,_4UL>::invert_transpose(mat<4UL,_4UL> *__return_storage_ptr__,mat<4UL,_4UL> *this)

{
  vec<4UL,_double> *lhs;
  double local_98;
  undefined1 local_90 [8];
  mat<4UL,_4UL> ret;
  mat<4UL,_4UL> *this_local;
  
  ret.rows[3].data[3] = (double)this;
  adjugate((mat<4UL,_4UL> *)local_90,this);
  lhs = operator[]((mat<4UL,_4UL> *)local_90,0);
  local_98 = dot<4ul,double>(lhs,this->rows);
  operator/(__return_storage_ptr__,(mat<4UL,_4UL> *)local_90,&local_98);
  return __return_storage_ptr__;
}

Assistant:

mat<nrows, ncols> invert_transpose() const
    {
        mat<nrows, ncols> ret = adjugate();
        return ret / dot(ret[0], rows[0]);
    }